

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void __thiscall
EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
          (EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *this)

{
  HashObject<256,_32> *in_RDI;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_> *this_00;
  hasher *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  *in_stack_fffffffffffffdf0;
  libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_> local_b [11];
  
  this_00 = local_b;
  google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>::
  libc_allocator_with_realloc(this_00);
  google::
  dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (key_equal *)this_00,(allocator_type *)in_RDI);
  google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>::
  ~libc_allocator_with_realloc(local_b);
  HashObject<256,_32>::HashObject(in_RDI,in_stack_fffffffffffffdcc);
  google::
  dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::set_empty_key((dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                   *)in_RDI,
                  (key_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  HashObject<256,_32>::HashObject(in_RDI,in_stack_fffffffffffffdcc);
  google::
  dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::set_deleted_key((dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                     *)in_RDI,
                    (key_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  return;
}

Assistant:

EasyUseDenseHashMap() {
    this->set_empty_key(-1);
    this->set_deleted_key(-2);
  }